

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Aig_Man_t * Saig_ManUnrollCOI(Aig_Man_t *pAig,int nFrames)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t **pObjMap_00;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int local_50;
  int local_4c;
  int f;
  int i;
  Aig_Obj_t **pObjMap;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManObjNumMax(pAig);
  pObjMap_00 = (Aig_Obj_t **)calloc((long)(nFrames * iVar1),8);
  iVar1 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar1 * nFrames);
  pcVar3 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar3;
  for (local_50 = 0; local_50 < nFrames; local_50 = local_50 + 1) {
    pAVar4 = Aig_ManConst1(pAig);
    pAVar5 = Aig_ManConst1(p);
    Aig_ObjSetFrames(pObjMap_00,nFrames,pAVar4,local_50,pAVar5);
  }
  for (local_50 = 0; local_50 < nFrames; local_50 = local_50 + 1) {
    local_4c = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(pAig);
      iVar2 = Aig_ManRegNum(pAig);
      if (iVar1 - iVar2 <= local_4c) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_4c);
      pAVar5 = Aig_ObjCreateCi(p);
      Aig_ObjSetFrames(pObjMap_00,nFrames,pAVar4,local_50,pAVar5);
      local_4c = local_4c + 1;
    }
  }
  local_4c = Aig_ManCiNum(pAig);
  iVar1 = Aig_ManRegNum(pAig);
  for (local_4c = local_4c - iVar1; iVar1 = Vec_PtrSize(pAig->vCis), local_4c < iVar1;
      local_4c = local_4c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_4c);
    pAVar5 = Aig_ObjCreateCi(p);
    Aig_ObjSetFrames(pObjMap_00,nFrames,pAVar4,0,pAVar5);
  }
  for (local_50 = 0; local_50 < nFrames; local_50 = local_50 + 1) {
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_4c);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Frames(pObjMap_00,nFrames,pAVar4,local_50);
        p1 = Aig_ObjChild1Frames(pObjMap_00,nFrames,pAVar4,local_50);
        pAVar5 = Aig_And(p,pAVar5,p1);
        Aig_ObjSetFrames(pObjMap_00,nFrames,pAVar4,local_50,pAVar5);
      }
    }
    for (local_4c = 0; iVar1 = Aig_ManRegNum(pAig), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar4 = Aig_ManLi(pAig,local_4c);
      pAVar5 = Aig_ManLo(pAig,local_4c);
      pAVar4 = Aig_ObjChild0Frames(pObjMap_00,nFrames,pAVar4,local_50);
      if (local_50 < nFrames + -1) {
        Aig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,local_50 + 1,pAVar4);
      }
    }
  }
  for (local_50 = nFrames + -1; local_50 < nFrames; local_50 = local_50 + 1) {
    local_4c = 0;
    while( true ) {
      iVar1 = Aig_ManCoNum(pAig);
      iVar2 = Aig_ManRegNum(pAig);
      if (iVar1 - iVar2 <= local_4c) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_4c);
      pAVar5 = Aig_ObjChild0Frames(pObjMap_00,nFrames,pAVar4,local_50);
      pAVar5 = Aig_ObjCreateCo(p,pAVar5);
      Aig_ObjSetFrames(pObjMap_00,nFrames,pAVar4,local_50,pAVar5);
      local_4c = local_4c + 1;
    }
  }
  if (pAig->pObjCopies == (Aig_Obj_t **)0x0) {
    pAig->pObjCopies = pObjMap_00;
    return p;
  }
  __assert_fail("pAig->pObjCopies == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                ,0x1e0,"Aig_Man_t *Saig_ManUnrollCOI(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManUnrollCOI( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;
    // create mapping for the frames nodes
    pObjMap = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    // create the only output
    for ( f = nFrames-1; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    // created lots of dangling nodes - no sweeping!
    //Aig_ManCleanup( pFrames );
    assert( pAig->pObjCopies == NULL );
    pAig->pObjCopies = pObjMap;
    return pFrames;
}